

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O0

char * skill_index_to_name(wchar_t i)

{
  char *local_18;
  char *name;
  wchar_t i_local;
  
  switch(i) {
  case L'\0':
    local_18 = "physical disarming";
    break;
  case L'\x01':
    local_18 = "magical disarming";
    break;
  case L'\x02':
    local_18 = "magic devices";
    break;
  case L'\x03':
    local_18 = "saving throws";
    break;
  case L'\x04':
    local_18 = "searching";
    break;
  default:
    local_18 = "unknown skill";
    break;
  case L'\x06':
    local_18 = "melee to hit";
    break;
  case L'\a':
    local_18 = "shooting to hit";
    break;
  case L'\b':
    local_18 = "throwing to hit";
    break;
  case L'\t':
    local_18 = "digging";
  }
  return local_18;
}

Assistant:

static const char *skill_index_to_name(int i)
{
	const char *name;

	switch (i) {
	case SKILL_DISARM_PHYS:
		name = "physical disarming";
		break;

	case SKILL_DISARM_MAGIC:
		name = "magical disarming";
		break;

	case SKILL_DEVICE:
		name = "magic devices";
		break;

	case SKILL_SAVE:
		name = "saving throws";
		break;

	case SKILL_SEARCH:
		name = "searching";
		break;

	case SKILL_TO_HIT_MELEE:
		name = "melee to hit";
		break;

	case SKILL_TO_HIT_BOW:
		name = "shooting to hit";
		break;

	case SKILL_TO_HIT_THROW:
		name = "throwing to hit";
		break;

	case SKILL_DIGGING:
		name = "digging";
		break;

	default:
		name = "unknown skill";
		break;
	}

	return name;
}